

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::testRunEnded(StreamingReporterBase *this,TestRunStats *param_2)

{
  Option<Catch::TestCaseInfo> *in_RSI;
  
  Ptr<Catch::ThreadedSectionInfo>::reset((Ptr<Catch::ThreadedSectionInfo> *)in_RSI);
  Option<Catch::TestCaseInfo>::reset(in_RSI);
  Option<Catch::GroupInfo>::reset((Option<Catch::GroupInfo> *)in_RSI);
  Option<Catch::TestRunInfo>::reset((Option<Catch::TestRunInfo> *)in_RSI);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& /* _testRunStats */ ) {
            currentSectionInfo.reset();
            unusedTestCaseInfo.reset();
            unusedGroupInfo.reset();
            testRunInfo.reset();
        }